

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

double gmlc::utilities::numeric_conversionComplete<double>(string_view V,double defValue)

{
  double dVar1;
  string_view V_00;
  string_view V_01;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  invalid_argument *anon_var_0;
  double res;
  size_t rem;
  size_t in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  size_type sVar6;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  double local_40;
  size_type local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  double local_8;
  
  V_00._M_str = (char *)in_stack_ffffffffffffff80;
  V_00._M_len = in_stack_ffffffffffffff78;
  bVar2 = nonNumericFirstOrLastCharacter(V_00);
  local_8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (!bVar2) {
    V_01._M_str = in_stack_ffffffffffffff90;
    V_01._M_len = in_stack_ffffffffffffff88;
    dVar1 = numConvComp<double>(V_01,in_stack_ffffffffffffff80);
    while (sVar6 = local_38,
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18),
          local_40 = dVar1, sVar6 < sVar4) {
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,local_38)
      ;
      iVar3 = isspace((int)*pvVar5);
      local_40 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
      if (iVar3 == 0) break;
      local_38 = local_38 + 1;
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}